

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O2

int m_uncomp_copy(aec_stream_conflict *strm)

{
  uint32_t *puVar1;
  internal_state_conflict *piVar2;
  uint32_t uVar3;
  
  piVar2 = strm->state;
  do {
    uVar3 = copysample(strm);
    if (uVar3 == 0) {
      return 0;
    }
    puVar1 = &piVar2->i;
    *puVar1 = *puVar1 - 1;
  } while (*puVar1 != 0);
  piVar2->mode = m_id;
  return 1;
}

Assistant:

static int m_uncomp_copy(struct aec_stream *strm)
{
    struct internal_state *state = strm->state;

    do {
        if (copysample(strm) == 0)
            return M_EXIT;
    } while(--state->i);

    state->mode = m_id;
    return M_CONTINUE;
}